

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_unix.cpp
# Opt level: O0

void __thiscall QSystemLocaleData::~QSystemLocaleData(QSystemLocaleData *this)

{
  QReadWriteLock *in_RDI;
  
  QList<QString>::~QList((QList<QString> *)0x72abc0);
  QByteArray::~QByteArray((QByteArray *)0x72abce);
  QByteArray::~QByteArray((QByteArray *)0x72abdc);
  QByteArray::~QByteArray((QByteArray *)0x72abea);
  QLocale::~QLocale((QLocale *)0x72abf8);
  QLocale::~QLocale((QLocale *)0x72ac06);
  QLocale::~QLocale((QLocale *)0x72ac14);
  QLocale::~QLocale((QLocale *)0x72ac22);
  QReadWriteLock::~QReadWriteLock(in_RDI);
  return;
}

Assistant:

QSystemLocaleData()
        : lc_numeric(QLocale::C)
         ,lc_time(QLocale::C)
         ,lc_monetary(QLocale::C)
         ,lc_messages(QLocale::C)
    {
        readEnvironment();
    }